

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

void __thiscall cs222::Pass2::writeObjectProgram(Pass2 *this,string *progName,string *progLength)

{
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  value_type vVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  reference puVar10;
  long lVar11;
  long lVar12;
  runtime_error *this_01;
  reference pbVar13;
  string local_bc0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> it_2;
  iterator __end1_2;
  iterator __begin1_2;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> it_1;
  iterator __end1_1;
  iterator __begin1_1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_aca;
  allocator local_ac9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  long local_a88;
  ofstream ofs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  stringstream local_808 [8];
  stringstream ss_2;
  ostream local_7f8 [376];
  undefined1 local_680 [8];
  string textRec;
  string textRecLength;
  string startAdd;
  undefined1 local_618 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  stringstream local_598 [8];
  stringstream ss_1;
  ostream local_588 [383];
  allocator local_409;
  undefined1 local_408 [8];
  string modRec;
  unsigned_long it;
  iterator __end1;
  iterator __begin1;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  allocator local_351;
  undefined1 local_350 [8];
  string temp;
  stringstream ss;
  ostream local_320 [380];
  int local_1a4;
  undefined1 local_1a0 [4];
  int i;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coAdd;
  string local_130 [8];
  string endRecord;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modRecords;
  undefined1 local_b0 [8];
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textRecords;
  string headerRecord;
  string objProgPath;
  string *progLength_local;
  string *progName_local;
  Pass2 *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&headerRecord.field_2 + 8),&this->srcFileName,".objprog");
  std::__cxx11::string::string
            ((string *)
             &textRecords.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_b0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&endRecord.field_2 + 8));
  std::__cxx11::string::string(local_130);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &coAdd.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,"H",progName);
  std::__cxx11::string::operator=
            ((string *)
             &textRecords.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (string *)
             &coAdd.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::__cxx11::string::~string
            ((string *)
             &coAdd.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  while (uVar5 = std::__cxx11::string::length(), uVar5 < 7) {
    std::__cxx11::string::operator+=
              ((string *)
               &textRecords.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node," ");
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a0);
  for (local_1a4 = 0; uVar5 = (ulong)local_1a4,
      sVar6 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->correspondingAddresses), uVar5 < sVar6; local_1a4 = local_1a4 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)(temp.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_350,"",&local_351);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    poVar7 = (ostream *)std::ostream::operator<<(local_320,std::hex);
    pvVar8 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->correspondingAddresses,(long)local_1a4);
    std::ostream::operator<<(poVar7,*pvVar8);
    std::operator>>((istream *)(temp.field_2._M_local_buf + 8),(string *)local_350);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0,(value_type *)local_350);
    while( true ) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1a0,(long)local_1a4);
      uVar5 = std::__cxx11::string::length();
      if (5 < uVar5) break;
      pvVar9 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1a0,(long)local_1a4);
      std::operator+(&local_378,"0",pvVar9);
      pvVar9 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1a0,(long)local_1a4);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_378);
      std::__cxx11::string::~string((string *)&local_378);
    }
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::stringstream::~stringstream((stringstream *)(temp.field_2._M_local_buf + 8));
  }
  pvVar9 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0,0);
  std::__cxx11::string::operator+=
            ((string *)
             &textRecords.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(string *)pvVar9);
  while (uVar5 = std::__cxx11::string::length(), uVar5 < 6) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                   "0",progLength);
    std::__cxx11::string::operator=((string *)progLength,(string *)&__range1);
    std::__cxx11::string::~string((string *)&__range1);
  }
  std::__cxx11::string::operator+=
            ((string *)
             &textRecords.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(string *)progLength);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&__end1._M_node,&this->modificationAddresses);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((iterator *)&it,&this->modificationAddresses);
  while (bVar3 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&it), bVar3) {
    puVar10 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator*
                        ((_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*> *)
                         &__end1._M_node);
    modRec.field_2._8_8_ = *puVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_408,"",&local_409);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::__cxx11::stringstream::stringstream(local_598);
    poVar7 = (ostream *)std::ostream::operator<<(local_588,std::hex);
    std::ostream::operator<<(poVar7,modRec.field_2._8_8_ + 1);
    std::operator>>((istream *)local_598,(string *)local_408);
    while (uVar5 = std::__cxx11::string::length(), uVar5 < 6) {
      std::operator+(&local_5b8,"0",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
      ;
      std::__cxx11::string::operator=((string *)local_408,(string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
    }
    std::operator+(&local_5f8,"M",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
    std::operator+(&local_5d8,&local_5f8,"05");
    std::__cxx11::string::operator=((string *)local_408,(string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&endRecord.field_2 + 8),(value_type *)local_408);
    std::__cxx11::stringstream::~stringstream(local_598);
    std::__cxx11::string::~string((string *)local_408);
    std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator++
              ((_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*> *)&__end1._M_node);
  }
  pvVar9 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618,"E",
                 pvVar9);
  std::__cxx11::string::operator=(local_130,(string *)local_618);
  std::__cxx11::string::~string((string *)local_618);
  startAdd.field_2._12_4_ = 0;
  do {
    sVar6 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->objectCode);
    if (sVar6 <= (ulong)(long)(int)startAdd.field_2._12_4_) {
      std::ofstream::ofstream(&local_a88,(string *)(headerRecord.field_2._M_local_buf + 8),_S_out);
      bVar4 = std::ios::operator!((ios *)((long)&local_a88 + *(long *)(local_a88 + -0x18)));
      if ((bVar4 & 1) != 0) {
        local_aca = 1;
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ac8,"Cannot open file: ",&local_ac9);
        std::operator+(&local_aa8,&local_ac8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&headerRecord.field_2 + 8));
        std::runtime_error::runtime_error(this_01,(string *)&local_aa8);
        local_aca = 0;
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range1_1,"Writing object program to ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&headerRecord.field_2 + 8));
      logDebug((string *)&__range1_1);
      std::__cxx11::string::~string((string *)&__range1_1);
      std::ios_base::setf((ios_base *)((long)&local_a88 + *(long *)(local_a88 + -0x18)),_S_left);
      poVar7 = std::operator<<((ostream *)&local_a88,
                               (string *)
                               &textRecords.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((iterator *)&__end1_1._M_node,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((iterator *)((long)&it_1.field_2 + 8),
            (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
      while (bVar3 = std::operator!=((_Self *)&__end1_1._M_node,(_Self *)((long)&it_1.field_2 + 8)),
            bVar3) {
        pbVar13 = std::
                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                               *)&__end1_1._M_node);
        std::__cxx11::string::string((string *)&__range1_2,(string *)pbVar13);
        poVar7 = std::operator<<((ostream *)&local_a88,(string *)&__range1_2);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&__range1_2);
        std::
        _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)&__end1_1._M_node);
      }
      this_00 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&endRecord.field_2 + 8);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((iterator *)&__end1_2._M_node,this_00);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((iterator *)((long)&it_2.field_2 + 8),this_00);
      while (bVar3 = std::operator!=((_Self *)&__end1_2._M_node,(_Self *)((long)&it_2.field_2 + 8)),
            bVar3) {
        pbVar13 = std::
                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                               *)&__end1_2._M_node);
        std::__cxx11::string::string(local_bc0,(string *)pbVar13);
        poVar7 = std::operator<<((ostream *)&local_a88,local_bc0);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_bc0);
        std::
        _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)&__end1_2._M_node);
      }
      poVar7 = std::operator<<((ostream *)&local_a88,local_130);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
      std::ofstream::~ofstream(&local_a88);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0);
      std::__cxx11::string::~string(local_130);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&endRecord.field_2 + 8));
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0);
      std::__cxx11::string::~string
                ((string *)
                 &textRecords.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::__cxx11::string::~string((string *)(headerRecord.field_2._M_local_buf + 8));
      return;
    }
    pvVar9 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a0,(long)(int)startAdd.field_2._12_4_);
    std::__cxx11::string::string
              ((string *)(textRecLength.field_2._M_local_buf + 8),(string *)pvVar9);
    std::__cxx11::string::string((string *)(textRec.field_2._M_local_buf + 8));
    pvVar9 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->objectCode,(long)(int)startAdd.field_2._12_4_);
    std::__cxx11::string::string((string *)local_680,(string *)pvVar9);
    uVar2 = startAdd.field_2._12_4_;
    while( true ) {
      startAdd.field_2._12_4_ = uVar2 + 1;
      uVar5 = std::__cxx11::string::length();
      bVar3 = false;
      if (uVar5 < 0x3c) {
        sVar6 = std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->objectCode);
        bVar3 = (ulong)(long)(int)startAdd.field_2._12_4_ < sVar6;
      }
      if (!bVar3) break;
      pvVar8 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->correspondingAddresses,(long)(int)startAdd.field_2._12_4_);
      vVar1 = *pvVar8;
      pvVar8 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->correspondingAddresses,(long)(int)uVar2);
      if (4 < vVar1 - *pvVar8) break;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at(&this->objectCode,(long)(int)startAdd.field_2._12_4_);
      lVar11 = std::__cxx11::string::length();
      lVar12 = std::__cxx11::string::length();
      if (0x3c < (ulong)(lVar11 + lVar12)) break;
      pvVar9 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&this->objectCode,(long)(int)startAdd.field_2._12_4_);
      std::__cxx11::string::operator+=((string *)local_680,(string *)pvVar9);
      uVar2 = startAdd.field_2._12_4_;
    }
    std::__cxx11::stringstream::stringstream(local_808);
    poVar7 = (ostream *)std::ostream::operator<<(local_7f8,std::hex);
    uVar5 = std::__cxx11::string::length();
    std::ostream::operator<<(poVar7,uVar5 >> 1);
    std::operator>>((istream *)local_808,(string *)(textRec.field_2._M_local_buf + 8));
    while (uVar5 = std::__cxx11::string::length(), uVar5 < 2) {
      std::operator+(&local_828,"0",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&textRec.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(textRec.field_2._M_local_buf + 8),(string *)&local_828);
      std::__cxx11::string::~string((string *)&local_828);
    }
    std::operator+(&local_888,"T",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&textRecLength.field_2 + 8));
    std::operator+(&local_868,&local_888,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&textRec.field_2 + 8));
    std::operator+(&local_848,&local_868,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680);
    std::__cxx11::string::operator=((string *)local_680,(string *)&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&local_868);
    std::__cxx11::string::~string((string *)&local_888);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b0,(value_type *)local_680);
    std::__cxx11::stringstream::~stringstream(local_808);
    std::__cxx11::string::~string((string *)local_680);
    std::__cxx11::string::~string((string *)(textRec.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(textRecLength.field_2._M_local_buf + 8));
  } while( true );
}

Assistant:

void Pass2::writeObjectProgram(std::string& progName,std::string& progLength) {
        std::string objProgPath = srcFileName + ".objprog";

        std::string headerRecord;
        std::deque<std::string> textRecords;
        std::deque<std::string> modRecords;
        std::string endRecord;

        headerRecord = "H" + progName;
        while(headerRecord.length() < 7)
            headerRecord += " ";

        std::deque<std::string> coAdd; //bta3tna elly hanshta8l 3leha
        for (int i = 0; i < correspondingAddresses.size(); ++i) {

            //DEBUG:
                    //std::cout << "Address bta3 " << i << " howa " << correspondingAddresses[i] << std::endl;

            std::stringstream ss;
            std::string temp = "";
            ss << std::hex << correspondingAddresses[i];
            ss >> temp;
            coAdd.push_back(temp);

            while(coAdd.at(i).length() < 6)
                coAdd.at(i) = "0" + coAdd.at(i);

        }

        headerRecord += coAdd.at(0);

        while(progLength.length() < 6)
            progLength = "0" + progLength;

        headerRecord += progLength; // now header record is done

        // now modification record era nya nya

        for (auto it : modificationAddresses) {

            std::string modRec = "";
            std::stringstream ss;
            ss << std::hex << it + 1;
            ss >> modRec;


            while (modRec.length() < 6)
                modRec = "0" + modRec;

            modRec = "M" + modRec + "05";
            modRecords.push_back(modRec);
        }

        endRecord = "E" + coAdd.at(0);

        for (int i = 0; i < objectCode.size(); ++i) {

            std::string startAdd = coAdd.at(i);
            std::string textRecLength;
            std::string textRec = objectCode.at(i);
            ++i;

            while( (textRec.length() < 60) && (i < objectCode.size()) ){
                if((correspondingAddresses.at(i) - correspondingAddresses.at(i-1)) <= 4){
                    if (objectCode.at(i).length() + textRec.length() <= 60){
                        textRec += objectCode.at(i);
                        ++i;
                    } else{
                        break;
                    }
                } else {
                    break;
                }
            }

            std::stringstream ss;
            ss << std::hex << textRec.length()/2;
            ss >> textRecLength;

            while (textRecLength.length() < 2){
                textRecLength = "0" + textRecLength;
            }

            textRec = "T" + startAdd + textRecLength + textRec;
            textRecords.push_back(textRec);

            --i;
        }


        // writing to file

        std::ofstream ofs(objProgPath);
        if (!ofs)
            throw std::runtime_error(std::string("Cannot open file: ") + objProgPath);

        logDebug("Writing object program to " + objProgPath);
        ofs.setf(std::ios::left);

        ofs << headerRecord << std::endl;

        for(auto it : textRecords)
            ofs << it << std::endl;

        for(auto it : modRecords)
            ofs << it << std::endl;

        ofs << endRecord << std::endl;

        ofs.close();

    }